

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O2

Promise<void> __thiscall
kj::anon_unknown_0::ConnectHttpService::SimpleHttpService::request
          (SimpleHttpService *this,HttpMethod method,StringPtr url,HttpHeaders *headers,
          AsyncInputStream *requestBody,Response *response)

{
  undefined4 in_register_00000034;
  undefined8 *in_stack_00000010;
  Own<kj::AsyncOutputStream,_std::nullptr_t> out;
  HttpHeaders local_88;
  undefined1 local_28 [16];
  
  HttpHeaders::HttpHeaders
            (&local_88,*(HttpHeaderTable **)(CONCAT44(in_register_00000034,method) + 8));
  local_28[0] = 0;
  (**(code **)*in_stack_00000010)(&out,in_stack_00000010,200,"OK",3,&local_88,local_28);
  HttpHeaders::~HttpHeaders(&local_88);
  (**(out.ptr)->_vptr_AsyncOutputStream)(&local_88,out.ptr,kj::_::ByteLiteral<12ul>,0xb);
  Promise<void>::attach<kj::Own<kj::AsyncOutputStream,decltype(nullptr)>>
            ((Promise<void> *)this,(Own<kj::AsyncOutputStream,_std::nullptr_t> *)&local_88);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_88);
  Own<kj::AsyncOutputStream,_std::nullptr_t>::dispose(&out);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> request(
        HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
        kj::AsyncInputStream& requestBody, Response& response) override {
      auto out = response.send(200, "OK"_kj, HttpHeaders(table));
      return out->write("hello there"_kjb).attach(kj::mv(out));
    }